

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::ZeroQueuedPages(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *this)

{
  uint pageCount;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FreePageEntry *__s;
  HANDLE pVVar5;
  ulong __n;
  
  bVar3 = HasZeroPageQueue(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6f5,"(HasZeroPageQueue())","HasZeroPageQueue()");
    if (!bVar3) {
LAB_006f7bc0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  __s = PopPendingZeroPage(this);
  if (__s != (FreePageEntry *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      segment = __s->segment;
      pageCount = __s->pageCount;
      pVVar1 = this->processHandle;
      pVVar5 = GetCurrentProcess();
      if (pVVar1 != pVVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x705,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar3) goto LAB_006f7bc0;
        *puVar4 = 0;
      }
      __n = (ulong)(pageCount << 0xc);
      if (DAT_015bf3e4 == '\x01') {
        js_memset_zero_nontemporal(__s,__n);
      }
      else {
        memset(__s,0,__n);
      }
      QueuePages(this,__s,pageCount,segment);
      __s = PopPendingZeroPage(this);
    } while (__s != (FreePageEntry *)0x0);
  }
  this->hasZeroQueuedPages = false;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ZeroQueuedPages()
{
    Assert(HasZeroPageQueue());

    while (true)
    {
        FreePageEntry * freePageEntry = PopPendingZeroPage();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        //
        // Do memset via non-temporal store to avoid evicting existing processor cache.
        // This helps low-end machines with limited cache size.
        //
        Assert(this->processHandle == GetCurrentProcess());
#if defined(_M_IX86) || defined(_M_X64)
        if (CONFIG_FLAG(ZeroMemoryWithNonTemporalStore))
        {
            js_memset_zero_nontemporal(freePageEntry, AutoSystemInfo::PageSize * pageCount);
        }
        else
#endif
        {
            memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
        }

        QueuePages(freePageEntry, pageCount, segment);
    }
    this->hasZeroQueuedPages = false;
}